

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckAlign(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  int iVar2;
  uint code;
  
  if ((node->tag != (Dict *)0x0) && ((node->tag->model & 0x10000) != 0)) {
    CheckValign(doc,node,attval);
    return;
  }
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    code = 0x256;
  }
  else {
    CheckLowerCaseAttrValue(doc,node,attval);
    if ((((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_CAPTION)) ||
        (BVar1 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001ced10), BVar1 != no)) ||
       (((attval->value != (ctmbstr)0x0 &&
         (iVar2 = prvTidytmbstrcasecmp(attval->value,"char"), iVar2 == 0)) &&
        (BVar1 = prvTidynodeHasCM(node,0x280), BVar1 != no)))) {
      return;
    }
    code = 0x22b;
  }
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckAlign( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"left", "right", "center", "justify", NULL};

    /* IMG, OBJECT, APPLET and EMBED use align for vertical position */
    if (node->tag && (node->tag->model & CM_IMG))
    {
        CheckValign( doc, node, attval );
        return;
    }

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval);

    /* currently CheckCaption(...) takes care of the remaining cases */
    if (nodeIsCAPTION(node))
        return;

    if (!AttrValueIsAmong(attval, values))
    {
        /* align="char" is allowed for elements with CM_TABLE|CM_ROW
           except CAPTION which is excluded above, */
        if( !(AttrValueIs(attval, "char")
              && TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)) )
             TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
}